

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

hash_request * __thiscall
libtorrent::aux::torrent::pick_hashes
          (hash_request *__return_storage_ptr__,torrent *this,peer_connection *peer)

{
  bool bVar1;
  pointer this_00;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *pieces;
  peer_connection *peer_local;
  torrent *this_local;
  
  need_hash_picker(this);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_torrent_hot_members).m_hash_picker);
  if (bVar1) {
    this_00 = ::std::
              unique_ptr<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
              ::operator->(&(this->super_torrent_hot_members).m_hash_picker);
    pieces = peer_connection::get_bitfield(peer);
    hash_picker::pick_hashes(__return_storage_ptr__,this_00,pieces);
  }
  else {
    memset(__return_storage_ptr__,0,0x14);
    hash_request::hash_request(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

hash_request torrent::pick_hashes(peer_connection* peer)
	{
		need_hash_picker();
		if (!m_hash_picker) return {};
		return m_hash_picker->pick_hashes(peer->get_bitfield());
	}